

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::OpenPathsFromPolyTree(PolyTree *polytree,Paths *paths)

{
  pointer ppPVar1;
  PolyNode *pPVar2;
  int iVar3;
  int i;
  long lVar4;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(paths,0);
  iVar3 = PolyTree::Total(polytree);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(paths,(long)iVar3);
  for (lVar4 = 0;
      ppPVar1 = (polytree->super_PolyNode).Childs.
                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(polytree->super_PolyNode).Childs.
                                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1) >> 3);
      lVar4 = lVar4 + 1) {
    pPVar2 = ppPVar1[lVar4];
    if (pPVar2->m_IsOpen == true) {
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::push_back(paths,&pPVar2->Contour);
    }
  }
  return;
}

Assistant:

void OpenPathsFromPolyTree(PolyTree& polytree, Paths& paths)
{
  paths.resize(0); 
  paths.reserve(polytree.Total());
  //Open paths are top level only, so ...
  for (int i = 0; i < polytree.ChildCount(); ++i)
    if (polytree.Childs[i]->IsOpen())
      paths.push_back(polytree.Childs[i]->Contour);
}